

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_shrinkstack(lua_State *L)

{
  StkId *ppTVar1;
  int iVar2;
  GCObject *pGVar3;
  StkId pTVar4;
  CallInfo *pCVar5;
  StkId pTVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  pCVar5 = L->ci;
  pTVar6 = L->top;
  while (pCVar5 != (CallInfo *)0x0) {
    ppTVar1 = &pCVar5->top;
    pCVar5 = pCVar5->previous;
    if (pTVar6 < *ppTVar1) {
      pTVar6 = *ppTVar1;
    }
  }
  iVar2 = (int)((ulong)((long)pTVar6 - (long)L->stack) >> 4);
  iVar10 = iVar2 + 8;
  if (-1 < iVar2 + 1) {
    iVar10 = iVar2 + 1;
  }
  iVar7 = (iVar10 >> 3) + iVar2 + 1;
  iVar10 = 0xf4236;
  if (iVar7 < 0xf4236) {
    iVar10 = iVar7;
  }
  if ((iVar2 < 1000000) && (iVar10 = iVar10 + 10, iVar10 < L->stacksize)) {
    if (-2 < iVar10) {
      pTVar6 = L->stack;
      iVar2 = L->stacksize;
      lVar9 = (long)iVar2;
      lVar11 = (long)iVar10;
      pTVar4 = (StkId)luaM_realloc_(L,pTVar6,lVar9 * 0x10,lVar11 * 0x10);
      L->stack = pTVar4;
      if (iVar2 < iVar10) {
        piVar8 = &pTVar4[lVar9].tt_;
        lVar9 = lVar11 - lVar9;
        do {
          *piVar8 = 0;
          piVar8 = piVar8 + 4;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      L->stacksize = iVar10;
      L->stack_last = pTVar4 + lVar11 + -5;
      L->top = (StkId)(((long)L->top - (long)pTVar6) + (long)pTVar4);
      pGVar3 = L->openupval;
      while (pGVar3 != (GCObject *)0x0) {
        (pGVar3->h).array = (TValue *)(((long)(pGVar3->h).array - (long)pTVar6) + (long)L->stack);
        pGVar3 = (pGVar3->gch).next;
      }
      for (pCVar5 = L->ci; pCVar5 != (CallInfo *)0x0; pCVar5 = pCVar5->previous) {
        pTVar4 = L->stack;
        pCVar5->top = (StkId)(((long)pCVar5->top - (long)pTVar6) + (long)pTVar4);
        pCVar5->func = (StkId)(((long)pCVar5->func - (long)pTVar6) + (long)pTVar4);
        if ((pCVar5->callstatus & 1) != 0) {
          (pCVar5->u).l.base = (StkId)((long)pTVar4 + ((long)(pCVar5->u).l.base - (long)pTVar6));
        }
      }
      return;
    }
    luaM_toobig(L);
  }
  return;
}

Assistant:

static int stackinuse (lua_State *L) {
  CallInfo *ci;
  StkId lim = L->top;
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    lua_assert(ci->top <= L->stack_last);
    if (lim < ci->top) lim = ci->top;
  }
  return cast_int(lim - L->stack) + 1;  /* part of stack in use */
}